

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canGrzip(void)

{
  wchar_t wVar1;
  
  if (canGrzip::tested == L'\0') {
    canGrzip::tested = L'\x01';
    wVar1 = systemf("grzip -V %s",redirectArgs);
    if (wVar1 == L'\0') {
      canGrzip::value = L'\x01';
    }
  }
  return canGrzip::value;
}

Assistant:

int
canGrzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("grzip -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}